

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O2

void __thiscall APITests::test_setup_all0(APITests *this)

{
  pointer piVar1;
  bool bVar2;
  undefined8 in_RAX;
  pointer piVar3;
  undefined4 uStack_38;
  int pin;
  
  _uStack_38 = in_RAX;
  GPIO::setmode(BOARD);
  piVar1 = (this->all_board_pins).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar3 = (this->all_board_pins).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; piVar3 != piVar1; piVar3 = piVar3 + 1) {
    _uStack_38 = CONCAT44(*piVar3,uStack_38);
    bVar2 = is_in<int&,std::vector<int,std::allocator<int>>&>
                      (&pin,&(this->pin_data).unimplemented_pins);
    if (!bVar2) {
      GPIO::setup(pin,IN,-1);
    }
  }
  GPIO::cleanup();
  return;
}

Assistant:

void test_setup_all0()
    {
        GPIO::setmode(GPIO::BOARD);
        for (auto pin : all_board_pins)
        {
            if (is_in(pin, pin_data.unimplemented_pins))
                continue;
            GPIO::setup(pin, GPIO::IN);
        }
        GPIO::cleanup();
    }